

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPUState.cpp
# Opt level: O0

void __thiscall CPUState::setIndexX(CPUState *this,uint16_t newValue,bool ignoreRegisterSize)

{
  bool bVar1;
  bool ignoreRegisterSize_local;
  uint16_t newValue_local;
  CPUState *this_local;
  
  if (ignoreRegisterSize) {
    this->m_IndexX = newValue;
  }
  else {
    bVar1 = areFlagsSet(this,'\x10');
    if (bVar1) {
      this->m_IndexX = (this->m_IndexX & 0xff00) + (newValue & 0xff);
    }
    else {
      this->m_IndexX = newValue;
    }
  }
  return;
}

Assistant:

void CPUState::setIndexX(uint16_t newValue, bool ignoreRegisterSize) {
    if (ignoreRegisterSize) {
        m_IndexX = newValue;
    } else {
        if (areFlagsSet(INDEX_SELECT)) {
            //set only the lower byte of m_Accumulator
            m_IndexX = (m_IndexX & 0xFF00) + (newValue & 0x00FF);
        } else {
            m_IndexX = newValue;
        }
    }
}